

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void cleanup_messages(void)

{
  void *__ptr;
  undefined1 auVar1 [16];
  message *__ptr_00;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar14;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  __ptr_00 = msghistory;
  lVar2 = (long)histsize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_00->msg + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar2 * 0x10 != lVar3);
  }
  free(__ptr_00);
  auVar1 = _DAT_0011b520;
  lVar2 = 0;
  prevturn = L'\0';
  msghistory = (message *)0x0;
  last_redraw_curline = L'\0';
  curline = L'\0';
  start_of_turn_curline = L'\xffffffff';
  histpos = L'\0';
  histsize = L'\0';
  auVar4 = _DAT_0011b4f0;
  auVar5 = _DAT_0011b500;
  auVar6 = _DAT_0011b2b0;
  auVar7 = _DAT_0011b2c0;
  do {
    auVar9 = auVar7 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar15._4_4_ = iVar8;
    auVar15._0_4_ = iVar8;
    auVar15._8_4_ = iVar14;
    auVar15._12_4_ = iVar14;
    auVar19._0_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar19._4_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar19._8_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar19._12_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar10._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar10._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar10._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar10._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar10 = auVar10 & auVar19;
    auVar9 = pshuflw(auVar15,auVar10,0xe8);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      msglines[0][lVar2] = '\0';
    }
    auVar9 = packssdw(auVar10,auVar10);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9._0_4_ >> 0x10 & 1) != 0) {
      msglines[1][lVar2] = '\0';
    }
    auVar9 = auVar6 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar16._4_4_ = iVar8;
    auVar16._0_4_ = iVar8;
    auVar16._8_4_ = iVar14;
    auVar16._12_4_ = iVar14;
    auVar20._0_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar20._4_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar20._8_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar20._12_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar11._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11 = auVar11 & auVar20;
    auVar9 = packssdw(auVar16,auVar11);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      msglines[2][lVar2] = '\0';
    }
    auVar9 = pshufhw(auVar11,auVar11,0x84);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      msglines[3][lVar2] = '\0';
    }
    auVar9 = auVar5 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar17._4_4_ = iVar8;
    auVar17._0_4_ = iVar8;
    auVar17._8_4_ = iVar14;
    auVar17._12_4_ = iVar14;
    auVar21._0_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar21._4_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar21._8_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar21._12_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar12._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar12._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar12._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar12._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar12 = auVar12 & auVar21;
    auVar9 = pshuflw(auVar17,auVar12,0xe8);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      msglines[4][lVar2] = '\0';
    }
    auVar9 = packssdw(auVar12,auVar12);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      msglines[5][lVar2] = '\0';
    }
    auVar9 = auVar4 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar14;
    auVar18._12_4_ = iVar14;
    auVar22._0_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar22._4_4_ = -(uint)(iVar8 < -0x7fffffd8);
    auVar22._8_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar22._12_4_ = -(uint)(iVar14 < -0x7fffffd8);
    auVar13._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar13._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar13._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar13._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar13 = auVar13 & auVar22;
    auVar9 = packssdw(auVar18,auVar13);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      msglines[6][lVar2] = '\0';
    }
    auVar9 = pshufhw(auVar13,auVar13,0x84);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      msglines[7][lVar2] = '\0';
    }
    lVar3 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 8;
    auVar7._8_8_ = lVar3 + 8;
    lVar3 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 8;
    auVar6._8_8_ = lVar3 + 8;
    lVar3 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 8;
    auVar5._8_8_ = lVar3 + 8;
    lVar3 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 8;
    auVar4._8_8_ = lVar3 + 8;
    lVar2 = lVar2 + 0x288;
  } while (lVar2 != 0xca8);
  return;
}

Assistant:

void cleanup_messages(void)
{
    int i;

    for (i = 0; i < histsize; i++) {
	if (msghistory[i].msg)
	    free(msghistory[i].msg);
    }
    free(msghistory);
    prevturn = 0;

    /* extra cleanup to prevent old messages from appearing in a new game */
    msghistory = NULL;
    curline = last_redraw_curline = 0;
    start_of_turn_curline = -1;
    histsize = histpos = 0;
    for (i = 0; i < MAX_MSGLINES; i++)
	msglines[i][0] = '\0';
}